

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomSphere *sphere,uint32_t indent,
          bool closing_brace)

{
  string *psVar1;
  bool bVar2;
  ostream *poVar3;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t n_01;
  uint32_t extraout_EDX;
  uint32_t n_02;
  uint32_t n_03;
  uint32_t indent_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  stringstream ss;
  allocator local_23d;
  uint32_t local_23c;
  pprint *local_238;
  string *local_230;
  string local_228;
  string local_208;
  size_type *local_1e8;
  undefined8 local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  local_23c = indent;
  local_230 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)sphere & 0xffffffff),n);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
  to_string_abi_cxx11_(&local_228,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar3 = ::std::operator<<(poVar3,(string *)&local_228);
  poVar3 = ::std::operator<<(poVar3," Sphere \"");
  poVar3 = ::std::operator<<(poVar3,(string *)(this + 0xa78));
  ::std::operator<<(poVar3,"\"\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  bVar2 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  n_02 = n_00;
  if (bVar2) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)sphere & 0xffffffff),n_00);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar3,"(\n");
    ::std::__cxx11::string::_M_dispose();
    print_prim_metas_abi_cxx11_
              (&local_208,this + 0x1a10,(PrimMeta *)(ulong)((int)sphere + 1),indent);
    ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::__cxx11::string::_M_dispose();
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)sphere & 0xffffffff),n_01);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
    ::std::operator<<(poVar3,")\n");
    ::std::__cxx11::string::_M_dispose();
    n_02 = extraout_EDX;
  }
  indent_00 = (int)sphere + 1;
  local_238 = (pprint *)((ulong)sphere & 0xffffffff);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)sphere & 0xffffffff),n_02);
  poVar3 = ::std::operator<<(local_1a8,(string *)&local_208);
  ::std::operator<<(poVar3,"{\n");
  ::std::__cxx11::string::_M_dispose();
  local_208.field_2._8_8_ = &local_208._M_string_length;
  local_208._M_string_length._0_4_ = 0;
  local_208.field_2._M_allocated_capacity = 0;
  local_1e0 = 0;
  local_1e8 = (size_type *)local_208.field_2._8_8_;
  ::std::__cxx11::string::string((string *)&local_1d8,"radius",&local_23d);
  print_typed_attr<double>
            (&local_228,(TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)(this + 0x1e68)
             ,&local_1d8,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_228);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  print_gprim_predefined<tinyusdz::GeomSphere>(&local_228,(GeomSphere *)this,indent_00);
  ::std::operator<<(local_1a8,(string *)&local_228);
  ::std::__cxx11::string::_M_dispose();
  print_props(&local_228,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),indent_00);
  ::std::operator<<(local_1a8,(string *)&local_228);
  ::std::__cxx11::string::_M_dispose();
  if ((char)local_23c != '\0') {
    pprint::Indent_abi_cxx11_(&local_228,local_238,n_03);
    poVar3 = ::std::operator<<(local_1a8,(string *)&local_228);
    ::std::operator<<(poVar3,"}\n");
    ::std::__cxx11::string::_M_dispose();
  }
  psVar1 = local_230;
  ::std::__cxx11::stringbuf::str();
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_208);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  return psVar1;
}

Assistant:

std::string to_string(const GeomSphere &sphere, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(sphere.spec) << " Sphere \""
     << sphere.name << "\"\n";
  if (sphere.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(sphere.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  std::set<std::string> table;

#if 0 // TODO
  if (sphere.propertyNames().size()) {
    // pxrUSD sorts property, so does TinyUSDZ also.
    std::vector<std::string> sortedPropertyNames;
    for (size_t i = 0; i < sphere.propertyNames().size(); i++) {
      sortedPropertyNames.push_back(sphere.propertyNames()[i].str());
    }
    std::sort(sortedPropertyNames.begin(), sortedPropertyNames.end());

    for (size_t i = 0; i < sortedPropertyNames.size(); i++) {
      std::string propName = sortedPropertyNames[i];

      PRINT_TYPED_ATTR(table, propName, sphere.radius, "radius", indent + 1)

      if (emit_gprim_predefined(ss, &sphere, propName, indent + 1, table)) {
        continue;
      }
      if (sphere.props.count(propName)) {
        ss << print_prop(sphere.props.at(propName), propName, indent + 1);
        table.insert(propName);
        continue;
      }

      // not found
      ss << fmt::format(
          "# Property `{}` is described in `properties` Prim metadatum, but "
          "not found in this Prim. Possibly USDC file is corrupted.\n");
    }
  } else {
    // members
    ss << print_typed_attr(sphere.radius, "radius", indent + 1);

    ss << print_gprim_predefined(sphere, indent + 1);

    ss << print_props(sphere.props, indent + 1);
  }
#else

  ss << print_typed_attr(sphere.radius, "radius", indent + 1);

  ss << print_gprim_predefined(sphere, indent + 1);

  ss << print_props(sphere.props, indent + 1);

#endif

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}